

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k051649.c
# Opt level: O0

void make_mixer_table(k051649_state *info,int voices)

{
  int iVar1;
  DEV_SMPL *pDVar2;
  int local_18;
  int val;
  int i;
  int voices_local;
  k051649_state *info_local;
  
  pDVar2 = (DEV_SMPL *)malloc((long)voices << 0xb);
  info->mixer_table = pDVar2;
  info->mixer_lookup = info->mixer_table + (voices << 8);
  for (local_18 = 0; local_18 < voices * 0x100; local_18 = local_18 + 1) {
    iVar1 = (local_18 << 7) / voices;
    info->mixer_lookup[local_18] = iVar1;
    info->mixer_lookup[-local_18] = -iVar1;
  }
  return;
}

Assistant:

static void make_mixer_table(k051649_state *info, int voices)
{
	int i;

	// allocate memory
	info->mixer_table = (DEV_SMPL*)malloc(sizeof(DEV_SMPL) * 512 * voices);

	// find the middle of the table
	info->mixer_lookup = info->mixer_table + (256 * voices);

	// fill in the table - 16 bit case
	for (i = 0; i < (voices * 256); i++)
	{
		int val = i * DEF_GAIN * 16 / voices;
		//if (val > 32767) val = 32767;
		info->mixer_lookup[ i] = val;
		info->mixer_lookup[-i] = -val;
	}
}